

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<0,_8,_1>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  bool bVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  int col;
  long lVar6;
  undefined1 auVar7 [16];
  bool bVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float local_68 [8];
  Type in0;
  float afStack_30 [2];
  undefined8 local_28;
  float local_20;
  int aiStack_18 [6];
  long lVar8;
  
  pfVar5 = in0.m_data.m_data[0].m_data + 1;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    pfVar4 = (float *)&in0;
    bVar9 = true;
    do {
      bVar2 = bVar9;
      lVar6 = 0;
      auVar7 = _DAT_00ada920;
      do {
        bVar9 = SUB164(auVar7 ^ _DAT_00ad8f80,4) == -0x80000000 &&
                SUB164(auVar7 ^ _DAT_00ad8f80,0) < -0x7ffffffd;
        if (bVar9) {
          fVar11 = 1.0;
          if (lVar3 != lVar6) {
            fVar11 = 0.0;
          }
          pfVar4[lVar6 * 2] = fVar11;
        }
        if (bVar9) {
          fVar11 = 1.0;
          if (lVar3 + -1 != lVar6) {
            fVar11 = 0.0;
          }
          pfVar4[lVar6 * 2 + 2] = fVar11;
        }
        lVar6 = lVar6 + 2;
        lVar8 = auVar7._8_8_;
        auVar7._0_8_ = auVar7._0_8_ + 2;
        auVar7._8_8_ = lVar8 + 2;
      } while (lVar6 != 4);
      lVar3 = 1;
      pfVar4 = pfVar5;
      bVar9 = false;
    } while (bVar2);
    in0.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    in0.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    in0.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    in0.m_data.m_data[2].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[1] = 0.0;
    lVar3 = 0;
    pfVar4 = (float *)&in0;
    bVar9 = true;
    do {
      bVar2 = bVar9;
      lVar6 = 0;
      do {
        pfVar4[lVar6 * 2] = *(float *)((long)&s_constInMat3x2 + lVar3 + lVar6 * 4);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      lVar3 = 0xc;
      pfVar4 = pfVar5;
      bVar9 = false;
    } while (bVar2);
  }
  fVar11 = (evalCtx->coords).m_data[0];
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  local_68[4] = 0.0;
  local_68[5] = 0.0;
  lVar3 = 0;
  pfVar5 = local_68;
  bVar9 = true;
  do {
    bVar2 = bVar9;
    lVar6 = 0;
    auVar10 = _DAT_00ada920;
    do {
      bVar9 = SUB164(auVar10 ^ _DAT_00ad8f80,4) == -0x80000000 &&
              SUB164(auVar10 ^ _DAT_00ad8f80,0) < -0x7ffffffd;
      if (bVar9) {
        fVar12 = 1.0;
        if (lVar3 != lVar6) {
          fVar12 = 0.0;
        }
        pfVar5[lVar6 * 2] = fVar12;
      }
      if (bVar9) {
        fVar12 = 1.0;
        if (lVar3 + -1 != lVar6) {
          fVar12 = 0.0;
        }
        pfVar5[(lVar6 + 1) * 2] = fVar12;
      }
      lVar6 = lVar6 + 2;
      lVar8 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar8 + 2;
    } while (lVar6 != 4);
    lVar3 = 1;
    pfVar5 = local_68 + 1;
    bVar9 = false;
  } while (bVar2);
  if (in1Type != INPUTTYPE_DYNAMIC) {
    fVar11 = -0.2;
  }
  lVar3 = 0;
  do {
    uVar1 = *(undefined8 *)in0.m_data.m_data[lVar3].m_data;
    *(ulong *)(local_68 + lVar3 * 2) =
         CONCAT44((float)((ulong)uVar1 >> 0x20) + fVar11,(float)uVar1 + fVar11);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_28 = CONCAT44(local_68[3] + local_68[2],local_68[0] + local_68[1]);
  local_20 = local_68[4] + local_68[5];
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar3]] = afStack_30[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 + in1);
	}